

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::
initialize<tinyusdz::Animatable<float>>
          (optional<tinyusdz::Animatable<float>> *this,Animatable<float> *value)

{
  if (*this != (optional<tinyusdz::Animatable<float>>)0x1) {
    tinyusdz::Animatable<float>::Animatable((Animatable<float> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<float>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::initialize(V &&) [T = tinyusdz::Animatable<float>, V = tinyusdz::Animatable<float>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }